

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool __thiscall AActor::CheckLocalView(AActor *this,int playernum)

{
  bool bVar1;
  uint uVar2;
  AActor *pAVar3;
  TFlags<ActorFlag3,_unsigned_int> local_20;
  int local_1c;
  AActor *pAStack_18;
  int playernum_local;
  AActor *this_local;
  
  local_1c = playernum;
  pAStack_18 = this;
  pAVar3 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)(&DAT_01ae7238 + (long)playernum * 0x2a0))
  ;
  if (pAVar3 == this) {
    this_local._7_1_ = true;
  }
  else {
    if (((AActor *)(&players)[(long)local_1c * 0x54] == this) &&
       (bVar1 = TObjPtr<AActor>::operator==
                          ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)local_1c * 0x2a0),(AActor *)0x0
                          ), !bVar1)) {
      pAVar3 = TObjPtr<AActor>::operator->
                         ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)local_1c * 0x2a0));
      bVar1 = false;
      if (pAVar3->player == (player_t *)0x0) {
        pAVar3 = TObjPtr<AActor>::operator->
                           ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)local_1c * 0x2a0));
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_20,
                   (int)pAVar3 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
        uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_20);
        bVar1 = uVar2 == 0;
      }
      if (!bVar1) {
        return false;
      }
      return true;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AActor::CheckLocalView (int playernum) const
{
	if (players[playernum].camera == this)
	{
		return true;
	}
	if (players[playernum].mo != this || players[playernum].camera == NULL)
	{
		return false;
	}
	if (players[playernum].camera->player == NULL &&
		!(players[playernum].camera->flags3 & MF3_ISMONSTER))
	{
		return true;
	}
	return false;
}